

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# follyqueue.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  thread reader;
  thread writer;
  thread tStack_28;
  thread local_20;
  
  if (1 < argc) {
    g_maxCount = atoi(argv[1]);
  }
  clock();
  std::thread::thread<int(&)(),,void>(&local_20,write_proc);
  std::thread::thread<int(&)(),,void>(&tStack_28,read_proc);
  std::thread::join();
  std::thread::join();
  clock();
  poVar1 = std::operator<<((ostream *)&std::cout,*argv);
  poVar1 = std::operator<<(poVar1," duration:");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::thread::~thread(&tStack_28);
  std::thread::~thread(&local_20);
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
	if (argc >=2 ){
		g_maxCount = atoi(argv[1]); 
		//printf("max count is %d\n",g_maxCount); 
	}


	clock_t start = clock();

	std::thread writer(write_proc); 
	std::thread reader(read_proc); 
	reader.join(); 
	writer.join(); 

	clock_t finish = clock();
	std::cout<<argv[0] << " duration:"<<finish - start<<"ms"<<std::endl;

	return 0; 

}